

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall ON_ClassArray<ON_MaterialRef>::Empty(ON_ClassArray<ON_MaterialRef> *this)

{
  uchar *puVar1;
  ON_MaterialRef *pOVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)this->m_count;
  if (0 < lVar3) {
    uVar4 = lVar3 + 1;
    lVar3 = lVar3 * 0x3c;
    do {
      pOVar2 = this->m_a;
      puVar1 = pOVar2[-1].m_material_backface_id.Data4 + lVar3 + 4;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)(puVar1 + 8) = 0;
      puVar1 = pOVar2[-1].m_material_backface_id.Data4 + lVar3 + -8;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)(puVar1 + 8) = 0;
      puVar1 = pOVar2[-1].m_material_id.Data4 + lVar3 + -8;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)(puVar1 + 8) = 0;
      puVar1 = pOVar2[-1].m_plugin_id.Data4 + lVar3 + -8;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *(undefined8 *)(puVar1 + 8) = 0;
      ON_MaterialRef::ON_MaterialRef
                ((ON_MaterialRef *)(this->m_a[-1].m_plugin_id.Data4 + lVar3 + -8));
      uVar4 = uVar4 - 1;
      lVar3 = lVar3 + -0x3c;
    } while (1 < uVar4);
  }
  this->m_count = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}